

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.h
# Opt level: O2

void __thiscall sptk::ScalarOperation::~ScalarOperation(ScalarOperation *this)

{
  pointer ppMVar1;
  
  this->_vptr_ScalarOperation = (_func_int **)&PTR__ScalarOperation_00116430;
  for (ppMVar1 = (this->modules_).
                 super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar1 !=
      (this->modules_).
      super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppMVar1 = ppMVar1 + 1) {
    if (*ppMVar1 != (ModuleInterface *)0x0) {
      (*(*ppMVar1)->_vptr_ModuleInterface[1])();
    }
  }
  std::
  _Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
  ::~_Vector_base(&(this->modules_).
                   super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
                 );
  return;
}

Assistant:

virtual ~ScalarOperation() {
    for (std::vector<ScalarOperation::ModuleInterface*>::iterator itr(
             modules_.begin());
         itr != modules_.end(); ++itr) {
      delete (*itr);
    }
  }